

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.cpp
# Opt level: O1

bool __thiscall
spvtools::opt::analysis::Function::IsSameImpl(Function *this,Type *that,IsSameCache *seen)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  pointer ppTVar4;
  ulong uVar5;
  long lVar3;
  
  iVar2 = (*that->_vptr_Type[0x24])(that);
  lVar3 = CONCAT44(extraout_var,iVar2);
  if (((lVar3 != 0) &&
      (iVar2 = (*this->return_type_->_vptr_Type[2])
                         (this->return_type_,*(undefined8 *)(lVar3 + 0x28),seen),
      (char)iVar2 != '\0')) &&
     ((long)(this->param_types_).
            super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)(this->param_types_).
            super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
            ._M_impl.super__Vector_impl_data._M_start ==
      *(long *)(lVar3 + 0x38) - *(long *)(lVar3 + 0x30))) {
    ppTVar4 = (this->param_types_).
              super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if ((this->param_types_).
        super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
        ._M_impl.super__Vector_impl_data._M_finish != ppTVar4) {
      uVar5 = 0;
      do {
        iVar2 = (*ppTVar4[uVar5]->_vptr_Type[2])
                          (ppTVar4[uVar5],*(undefined8 *)(*(long *)(lVar3 + 0x30) + uVar5 * 8),seen)
        ;
        if ((char)iVar2 == '\0') {
          return false;
        }
        uVar5 = uVar5 + 1;
        ppTVar4 = (this->param_types_).
                  super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
      } while (uVar5 < (ulong)((long)(this->param_types_).
                                     super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar4 >> 3
                              ));
    }
    bVar1 = analysis::Type::HasSameDecorations(&this->super_Type,that);
    return bVar1;
  }
  return false;
}

Assistant:

bool Function::IsSameImpl(const Type* that, IsSameCache* seen) const {
  const Function* ft = that->AsFunction();
  if (!ft) return false;
  if (!return_type_->IsSameImpl(ft->return_type_, seen)) return false;
  if (param_types_.size() != ft->param_types_.size()) return false;
  for (size_t i = 0; i < param_types_.size(); ++i) {
    if (!param_types_[i]->IsSameImpl(ft->param_types_[i], seen)) return false;
  }
  return HasSameDecorations(that);
}